

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

void __thiscall Physical::Physical(Physical *this,Physical *p)

{
  Physical *p_local;
  Physical *this_local;
  
  this->_vptr_Physical = (_func_int **)&PTR__Physical_001904a0;
  std::__cxx11::string::string((string *)&this->physicalDescription);
  Unit::Unit(&this->physicalUnit);
  std::__cxx11::string::operator=
            ((string *)&this->physicalDescription,(string *)&p->physicalDescription);
  this->dQuantity = p->dQuantity;
  Unit::operator=(&this->physicalUnit,&p->physicalUnit);
  return;
}

Assistant:

Physical::Physical(const Physical &p)
{
	physicalDescription = p.physicalDescription;
	dQuantity = p.dQuantity;
	physicalUnit = p.physicalUnit;
}